

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::clara::detail::Opt::Opt(Opt *this,bool *ref)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<Catch::clara::detail::BoundRef> local_20;
  
  local_20.super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  local_20.super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  local_20.super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  local_20.super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b79d08;
  local_20.super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_20.super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  local_20.super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi)[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00b79d58;
  *(bool **)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_20.super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)[1]._M_use_count = ref;
  ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl
            (&this->super_ParserRefImpl<Catch::clara::detail::Opt>,&local_20);
  if (local_20.super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_20.
               super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ParserRefImpl<Catch::clara::detail::Opt>).
  super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__Opt_00b79be0;
  (this->m_optNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_optNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_optNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit Opt( bool &ref ) : ParserRefImpl( std::make_shared<BoundFlagRef>( ref ) ) {}